

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metadata_test.cc
# Opt level: O3

bool __thiscall
google::protobuf::compiler::cpp::anon_unknown_0::CppMetadataTest::CaptureMetadata
          (CppMetadataTest *this,string *filename,FileDescriptorProto *file,string *pb_h,
          GeneratedCodeInfo *pb_h_info,string *proto_h,GeneratedCodeInfo *proto_h_info,string *pb_cc
          )

{
  char *pcVar1;
  bool bVar2;
  Nonnull<const_char_*> failure_msg;
  string_view filename_00;
  string output_base;
  string cpp_out;
  CppGenerator cpp_generator;
  CommandLineInterface cli;
  undefined1 local_3b0 [48];
  string local_380;
  Status local_350;
  AlphaNum *local_348;
  undefined1 local_340 [48];
  undefined1 local_310 [48];
  undefined1 local_2e0 [32];
  string local_2c0;
  CppGenerator local_2a0;
  CommandLineInterface local_270;
  
  CommandLineInterface::CommandLineInterface(&local_270);
  local_2a0.runtime_include_base_._M_dataplus._M_p =
       (pointer)&local_2a0.runtime_include_base_.field_2;
  local_2a0.super_CodeGenerator._vptr_CodeGenerator = (_func_int **)&PTR__CppGenerator_0190c188;
  local_2a0.opensource_runtime_ = true;
  local_2a0.runtime_include_base_._M_string_length = 0;
  local_2a0.runtime_include_base_.field_2._M_local_buf[0] = '\0';
  local_380._M_dataplus._M_p = (pointer)&local_380.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_380,"--cpp_out","");
  local_310._0_8_ = local_310 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,anon_var_dwarf_a22956 + 5);
  CommandLineInterface::RegisterGenerator
            (&local_270,&local_380,&local_2a0.super_CodeGenerator,(string *)local_310);
  if ((undefined1 *)local_310._0_8_ != local_310 + 0x10) {
    operator_delete((void *)local_310._0_8_,local_310._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_380._M_dataplus._M_p != &local_380.field_2) {
    operator_delete(local_380._M_dataplus._M_p,local_380.field_2._M_allocated_capacity + 1);
  }
  local_380._M_dataplus._M_p = &DAT_00000064;
  local_380._M_string_length = 0x11b7020;
  testing::TempDir_abi_cxx11_();
  local_310._0_8_ = local_3b0._8_8_;
  local_310._8_8_ = local_3b0._0_8_;
  absl::lts_20250127::StrCat_abi_cxx11_
            (&local_2c0,(lts_20250127 *)&local_380,(AlphaNum *)local_310,(AlphaNum *)local_3b0._8_8_
            );
  pcVar1 = local_3b0 + 0x10;
  if ((char *)local_3b0._0_8_ != pcVar1) {
    operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
  }
  bVar2 = annotation_test_util::RunProtoCompiler
                    ((string *)this,&local_2c0,&local_270,(FileDescriptorProto *)filename);
  if (!bVar2) {
    bVar2 = false;
    goto LAB_00a2cedd;
  }
  testing::TempDir_abi_cxx11_();
  local_380._M_dataplus._M_p = (pointer)local_348;
  local_380._M_string_length = local_350.rep_;
  local_310._0_8_ = (AlphaNum *)0x1;
  local_310._8_8_ = "/";
  filename_00._M_str = (char *)local_348;
  filename_00._M_len = (size_t)(this->super_Test)._vptr_Test;
  StripProto_abi_cxx11_
            ((string *)local_2e0,
             (cpp *)(this->super_Test).gtest_flag_saver_._M_t.
                    super___uniq_ptr_impl<testing::internal::GTestFlagSaver,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_testing::internal::GTestFlagSaver_*,_std::default_delete<testing::internal::GTestFlagSaver>_>
                    .super__Head_base<0UL,_testing::internal::GTestFlagSaver_*,_false>._M_head_impl,
             filename_00);
  local_3b0._0_8_ = local_2e0._8_8_;
  local_3b0._8_8_ = local_2e0._0_8_;
  absl::lts_20250127::StrCat_abi_cxx11_
            ((string *)(local_340 + 0x10),(lts_20250127 *)&local_380,(AlphaNum *)local_310,
             (AlphaNum *)local_3b0,(AlphaNum *)pb_h_info);
  if ((AlphaNum *)local_2e0._0_8_ != (AlphaNum *)(local_2e0 + 0x10)) {
    operator_delete((void *)local_2e0._0_8_,local_2e0._16_8_ + 1);
  }
  if ((StatusRep *)local_350.rep_ != (StatusRep *)local_340) {
    operator_delete((void *)local_350.rep_,local_340._0_8_ + 1);
  }
  if (file == (FileDescriptorProto *)0x0 || pb_h == (string *)0x0) {
LAB_00a2ceb2:
    bVar2 = true;
  }
  else {
    local_380._M_dataplus._M_p = (pointer)local_340._24_8_;
    local_380._M_string_length = local_340._16_8_;
    local_310._0_8_ = &DAT_00000005;
    local_310._8_8_ = ".pb.h";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_3b0,(lts_20250127 *)&local_380,(AlphaNum *)local_310,
               (AlphaNum *)local_340._24_8_);
    File::ReadFileToString((File *)&local_350,(string *)local_3b0,(string *)file,false);
    if ((StatusRep *)local_350.rep_ == (StatusRep *)0x1) {
      failure_msg = (Nonnull<const_char_*>)0x0;
    }
    else {
      failure_msg = absl::lts_20250127::status_internal::MakeCheckFailString
                              (&local_350,
                               "File::GetContents(absl::StrCat(output_base, \".pb.h\"), pb_h, true) is OK"
                              );
      if ((local_350.rep_ & 1) == 0) {
        absl::lts_20250127::status_internal::StatusRep::Unref((StatusRep *)local_350.rep_);
      }
    }
    if ((char *)local_3b0._0_8_ != pcVar1) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    if ((StatusRep *)local_350.rep_ != (StatusRep *)0x1) {
      absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&local_380,
                 "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/compiler/cpp/metadata_test.cc"
                 ,0x40,failure_msg);
      absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal
                ((LogMessageFatal *)&local_380);
    }
    local_380._M_dataplus._M_p = (pointer)local_340._24_8_;
    local_380._M_string_length = local_340._16_8_;
    local_310._0_8_ = &DAT_0000000a;
    local_310._8_8_ = ".pb.h.meta";
    absl::lts_20250127::StrCat_abi_cxx11_
              ((string *)local_3b0,(lts_20250127 *)&local_380,(AlphaNum *)local_310,
               (AlphaNum *)local_340._24_8_);
    bVar2 = annotation_test_util::DecodeMetadata((string *)local_3b0,(GeneratedCodeInfo *)pb_h);
    if ((char *)local_3b0._0_8_ != pcVar1) {
      operator_delete((void *)local_3b0._0_8_,local_3b0._16_8_ + 1);
    }
    if (bVar2) goto LAB_00a2ceb2;
    bVar2 = false;
  }
  if ((StatusRep *)local_340._16_8_ != (StatusRep *)(local_340 + 0x20)) {
    operator_delete((void *)local_340._16_8_,local_340._32_8_ + 1);
  }
LAB_00a2cedd:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2c0._M_dataplus._M_p != &local_2c0.field_2) {
    operator_delete(local_2c0._M_dataplus._M_p,local_2c0.field_2._M_allocated_capacity + 1);
  }
  CppGenerator::~CppGenerator(&local_2a0);
  CommandLineInterface::~CommandLineInterface(&local_270);
  return bVar2;
}

Assistant:

bool CaptureMetadata(const std::string& filename, FileDescriptorProto* file,
                       std::string* pb_h, GeneratedCodeInfo* pb_h_info,
                       std::string* proto_h, GeneratedCodeInfo* proto_h_info,
                       std::string* pb_cc) {
    CommandLineInterface cli;
    CppGenerator cpp_generator;
    cli.RegisterGenerator("--cpp_out", &cpp_generator, "");
    std::string cpp_out = absl::StrCat(
        "--cpp_out=annotate_headers=true,"
        "annotation_pragma_name=pragma_name,"
        "annotation_guard_name=guard_name:",
        ::testing::TempDir());

    const bool result = atu::RunProtoCompiler(filename, cpp_out, &cli, file);

    if (!result) {
      return result;
    }

    std::string output_base =
        absl::StrCat(::testing::TempDir(), "/", StripProto(filename));

    if (pb_cc != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".pb.cc"),
                                      pb_cc, true));
    }

    if (pb_h != nullptr && pb_h_info != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".pb.h"), pb_h,
                                      true));
      if (!atu::DecodeMetadata(absl::StrCat(output_base, ".pb.h.meta"),
                               pb_h_info)) {
        return false;
      }
    }

    if (proto_h != nullptr && proto_h_info != nullptr) {
      ABSL_CHECK_OK(File::GetContents(absl::StrCat(output_base, ".proto.h"),
                                      proto_h, true));
      if (!atu::DecodeMetadata(absl::StrCat(output_base, ".proto.h.meta"),
                               proto_h_info)) {
        return false;
      }
    }

    return true;
  }